

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall httplib::Server::read_and_close_socket(Server *this,socket_t sock)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  undefined1 auStack_e8 [8];
  fd_set fds;
  undefined1 local_50 [8];
  bool connection_close;
  ulong local_40;
  int local_34;
  
  iVar2 = sock + 0x3f;
  if (-1 < sock) {
    iVar2 = sock;
  }
  uVar5 = 1L << ((byte)(sock % 0x40) & 0x3f);
  fds.fds_bits[0xf] = (__fd_mask)this;
  fds.fds_bits[0xd] = 0;
  fds.fds_bits[0xe] = 0;
  fds.fds_bits[0xb] = 0;
  fds.fds_bits[0xc] = 0;
  fds.fds_bits[9] = 0;
  fds.fds_bits[10] = 0;
  fds.fds_bits[7] = 0;
  fds.fds_bits[8] = 0;
  fds.fds_bits[5] = 0;
  fds.fds_bits[6] = 0;
  fds.fds_bits[3] = 0;
  fds.fds_bits[4] = 0;
  fds.fds_bits[1] = 0;
  fds.fds_bits[2] = 0;
  auStack_e8 = (undefined1  [8])0x0;
  fds.fds_bits[0] = 0;
  fds.fds_bits[(long)(iVar2 >> 6) + -1] = fds.fds_bits[(long)(iVar2 >> 6) + -1] | uVar5;
  local_34 = sock + 1;
  local_50 = (undefined1  [8])0x5;
  _connection_close = 0;
  bVar1 = false;
  local_40 = (ulong)(uint)sock;
  iVar3 = select(local_34,(fd_set *)auStack_e8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_50);
  if (0 < iVar3) {
    iVar3 = 5;
    do {
      auStack_e8 = (undefined1  [8])&PTR__Stream_0014b400;
      fds.fds_bits[0] = CONCAT44(fds.fds_bits[0]._4_4_,(int)local_40);
      local_50 = (undefined1  [8])((ulong)local_50 & 0xffffffffffffff00);
      bVar1 = process_request((Server *)fds.fds_bits[0xf],(Stream *)auStack_e8,iVar3 == 1,
                              (bool *)local_50);
      if (((!bVar1) || (((ulong)local_50 & 1) != 0)) || (iVar3 = iVar3 - (uint)bVar1, iVar3 < 1))
      break;
      fds.fds_bits[0xd] = 0;
      fds.fds_bits[0xe] = 0;
      fds.fds_bits[0xb] = 0;
      fds.fds_bits[0xc] = 0;
      fds.fds_bits[9] = 0;
      fds.fds_bits[10] = 0;
      fds.fds_bits[7] = 0;
      fds.fds_bits[8] = 0;
      fds.fds_bits[5] = 0;
      fds.fds_bits[6] = 0;
      fds.fds_bits[3] = 0;
      fds.fds_bits[4] = 0;
      fds.fds_bits[1] = 0;
      fds.fds_bits[2] = 0;
      auStack_e8 = (undefined1  [8])0x0;
      fds.fds_bits[0] = 0;
      fds.fds_bits[(long)(iVar2 >> 6) + -1] = fds.fds_bits[(long)(iVar2 >> 6) + -1] | uVar5;
      local_50 = (undefined1  [8])0x5;
      _connection_close = 0;
      iVar4 = select(local_34,(fd_set *)auStack_e8,(fd_set *)0x0,(fd_set *)0x0,(timeval *)local_50);
    } while (0 < iVar4);
  }
  close((int)local_40);
  return bVar1;
}

Assistant:

inline bool Server::read_and_close_socket(socket_t sock)
{
    return detail::read_and_close_socket(
        sock,
        true,
        [this](Stream& strm, bool last_connection, bool& connection_close) {
            return process_request(strm, last_connection, connection_close);
        });
}